

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<void> __thiscall
kj::
newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
          (kj *this,WebSocketPipeImpl *adapterConstructorParams,
          OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
          *adapterConstructorParams_1)

{
  uint uVar1;
  undefined8 *puVar2;
  Promise<void> PVar3;
  Fault local_60;
  void *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar2 = (undefined8 *)operator_new(0x1c8);
  puVar2[1] = 0;
  *puVar2 = &PTR_onReady_0045fdc0;
  puVar2[2] = &PTR_fulfill_0045fe08;
  *(undefined1 *)(puVar2 + 3) = 0;
  *(undefined1 *)(puVar2 + 0x2f) = 0;
  *(undefined1 *)(puVar2 + 0x30) = 1;
  uVar1 = adapterConstructorParams_1->tag;
  if (uVar1 == 1) {
    local_58 = (adapterConstructorParams_1->field_1).forceAligned;
    uStack_50 = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 8);
  }
  if (uVar1 == 2) {
    local_58 = (adapterConstructorParams_1->field_1).forceAligned;
    uStack_50 = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 8);
  }
  if (uVar1 == 3) {
    local_48 = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 0x10);
    local_58 = (adapterConstructorParams_1->field_1).forceAligned;
    uStack_50 = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 8);
  }
  puVar2[0x31] = &PTR_send_0045fe68;
  puVar2[0x32] = puVar2 + 2;
  puVar2[0x33] = adapterConstructorParams;
  *(uint *)(puVar2 + 0x34) = uVar1;
  if (uVar1 == 1) {
    puVar2[0x35] = local_58;
    puVar2[0x36] = uStack_50;
  }
  if (uVar1 == 2) {
    puVar2[0x35] = local_58;
    puVar2[0x36] = uStack_50;
  }
  if (uVar1 == 3) {
    puVar2[0x37] = local_48;
    puVar2[0x35] = local_58;
    puVar2[0x36] = uStack_50;
  }
  puVar2[0x38] = 0;
  if ((adapterConstructorParams->state).ptr == (WebSocket *)0x0) {
    (adapterConstructorParams->state).ptr = (WebSocket *)(puVar2 + 0x31);
    *(undefined8 **)this =
         &_::
          HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
          ::instance;
    *(undefined8 **)(this + 8) = puVar2;
    PVar3.super_PromiseBase.node.ptr = (PromiseNode *)&PTR_send_0045fe68;
    PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar3.super_PromiseBase.node;
  }
  local_60.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  _::Debug::Fault::init
            (&local_60,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
            );
  _::Debug::Fault::fatal(&local_60);
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}